

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FLinePortal *port,FLinePortal *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  FLinePortal *def_local;
  FLinePortal *port_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = FSerializer::operator()(arc,"origin",(line_t_conflict **)port);
    pFVar2 = FSerializer::operator()(pFVar2,"destination",(line_t_conflict **)&port->mDestination);
    pFVar2 = FSerializer::operator()(pFVar2,"displacement",&port->mDisplacement);
    pFVar2 = FSerializer::operator()(pFVar2,"type",&port->mType);
    pFVar2 = FSerializer::operator()(pFVar2,"flags",&port->mFlags);
    pFVar2 = FSerializer::operator()(pFVar2,"defflags",&port->mDefFlags);
    pFVar2 = FSerializer::operator()(pFVar2,"align",&port->mAlign);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FLinePortal &port, FLinePortal *def)
{
	if (arc.BeginObject(key))
	{
		arc("origin", port.mOrigin)
			("destination", port.mDestination)
			("displacement", port.mDisplacement)
			("type", port.mType)
			("flags", port.mFlags)
			("defflags", port.mDefFlags)
			("align", port.mAlign)
			.EndObject();
	}
	return arc;
}